

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerMSL::variable_storage_requires_stage_io(CompilerMSL *this,StorageClass storage)

{
  bool bVar1;
  byte local_2a;
  byte local_29;
  StorageClass storage_local;
  CompilerMSL *this_local;
  
  if (storage == Output) {
    this_local._7_1_ = (bool)((this->capture_output_to_buffer ^ 0xffU) & 1);
  }
  else if (storage == Input) {
    bVar1 = is_tesc_shader(this);
    if ((!bVar1) || (local_29 = 0, ((this->msl_options).multi_patch_workgroup & 1U) == 0)) {
      bVar1 = is_tese_shader(this);
      local_2a = 0;
      if (bVar1) {
        local_2a = (this->msl_options).raw_buffer_tese_input;
      }
      local_29 = local_2a ^ 0xff;
    }
    this_local._7_1_ = (bool)(local_29 & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CompilerMSL::variable_storage_requires_stage_io(spv::StorageClass storage) const
{
	if (storage == StorageClassOutput)
		return !capture_output_to_buffer;
	else if (storage == StorageClassInput)
		return !(is_tesc_shader() && msl_options.multi_patch_workgroup) &&
		       !(is_tese_shader() && msl_options.raw_buffer_tese_input);
	else
		return false;
}